

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_reactor.hpp
# Opt level: O1

void __thiscall
asio::detail::epoll_reactor::
schedule_timer<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
          (epoll_reactor *this,
          timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          *queue,time_type *time,per_timer_data *timer,wait_op *op)

{
  atomic_count *paVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  timer_queue_base *ptVar5;
  itimerspec new_timeout;
  itimerspec old_timeout;
  itimerspec local_78;
  itimerspec local_50;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (this->shutdown_ == true) {
    scheduler::post_immediate_completion(this->scheduler_,&op->super_operation,false);
  }
  else {
    bVar2 = timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
            ::enqueue_timer(queue,time,timer,op);
    LOCK();
    paVar1 = &this->scheduler_->outstanding_work_;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
    if (bVar2) {
      if (this->timer_fd_ == -1) {
        local_78.it_interval.tv_sec._0_4_ = 0x80000009;
        local_78.it_interval._4_8_ = &this->interrupter_;
        epoll_ctl(this->epoll_fd_,3,(this->interrupter_).read_descriptor_,(epoll_event *)&local_78);
      }
      else {
        local_78.it_interval.tv_sec._0_4_ = 0;
        local_78.it_interval.tv_sec._4_4_ = 0;
        local_78.it_interval.tv_nsec._0_4_ = 0;
        local_78.it_interval.tv_nsec._4_4_ = 0;
        lVar4 = 300000000;
        for (ptVar5 = (this->timer_queues_).first_; ptVar5 != (timer_queue_base *)0x0;
            ptVar5 = ptVar5->next_) {
          iVar3 = (*ptVar5->_vptr_timer_queue_base[4])(ptVar5,lVar4);
          lVar4 = CONCAT44(extraout_var,iVar3);
        }
        local_78.it_value.tv_sec = lVar4 / 1000000;
        local_78.it_value.tv_nsec = 1;
        if (lVar4 != 0) {
          local_78.it_value.tv_nsec = (lVar4 % 1000000) * 1000;
        }
        timerfd_settime(this->timer_fd_,(uint)(lVar4 == 0),&local_78,&local_50);
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void epoll_reactor::schedule_timer(timer_queue<Time_Traits>& queue,
    const typename Time_Traits::time_type& time,
    typename timer_queue<Time_Traits>::per_timer_data& timer, wait_op* op)
{
  mutex::scoped_lock lock(mutex_);

  if (shutdown_)
  {
    scheduler_.post_immediate_completion(op, false);
    return;
  }

  bool earliest = queue.enqueue_timer(time, timer, op);
  scheduler_.work_started();
  if (earliest)
    update_timeout();
}